

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

void __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::~MemPool
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this)

{
  FixedArena *pFVar1;
  MemSegment *pMVar2;
  MemSegment *pMVar3;
  byte bVar4;
  
  if (this->m_segList != (MemSegment *)0x0) {
    pFVar1 = this->m_arena;
    bVar4 = pFVar1->m_used;
    pMVar3 = this->m_segList;
    do {
      pMVar2 = pMVar3->m_next;
      if ((((bVar4 & 1) != 0) && ((MemSegment *)pFVar1->m_page == pMVar3)) &&
         (pFVar1->m_size == pMVar3->m_size)) {
        pFVar1->m_used = false;
        bVar4 = 0;
      }
      pMVar3 = pMVar2;
    } while (pMVar2 != (MemSegment *)0x0);
  }
  return;
}

Assistant:

~MemPool()
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            void* ptr = seg;
            size_type size = seg->getSize ();
            seg = seg->getNext ();
            m_logger.logFreeSegment (ptr, size);
            m_arena.freeSegment (ptr, size);
        }
    }